

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O3

void __thiscall
Assimp::DeboneProcess::SplitMesh
          (DeboneProcess *this,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
          *poNewMeshes)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  iterator iVar4;
  byte bVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  Logger *this_00;
  aiBone **ppaVar9;
  aiMesh *mesh;
  uint uVar10;
  ulong uVar11;
  undefined4 uVar12;
  int iVar13;
  aiBone *paVar14;
  uint uVar15;
  ulong uVar16;
  aiFace *paVar17;
  ulong uVar18;
  aiMesh *this_01;
  uint uVar19;
  ulong uVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subFaces;
  pair<aiMesh_*,_const_aiBone_*> push_pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faceBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> facesPerBone;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  pair<aiMesh_*,_const_aiBone_*> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  float local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
  *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_80 = (vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
              *)poNewMeshes;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)pMesh->mNumBones,(bool *)&local_78,(allocator_type *)&local_b8);
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,(ulong)pMesh->mNumVertices,(value_type_conflict2 *)&local_b8,
             (allocator_type *)&local_98);
  uVar7 = pMesh->mNumBones;
  if (uVar7 != 0) {
    ppaVar9 = pMesh->mBones;
    uVar20 = 0;
    do {
      paVar14 = ppaVar9[uVar20];
      if (paVar14->mNumWeights != 0) {
        uVar16 = 1L << ((byte)uVar20 & 0x3f);
        bVar5 = (byte)uVar20 & 0x3f;
        local_60 = -2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5;
        uVar18 = 0;
        do {
          fVar2 = paVar14->mWeights[uVar18].mWeight;
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            local_9c = fVar2;
            if (this->mThreshold <= fVar2) {
              uVar8 = (ulong)paVar14->mWeights[uVar18].mVertexId;
              uVar11 = (ulong)*(uint *)(CONCAT71(local_78.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_78.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                       uVar8 * 4);
              uVar12 = (undefined4)uVar20;
              if ((uVar11 == 0xffffffff) || (uVar12 = 0xfffffffe, uVar20 != uVar11)) {
                *(undefined4 *)
                 (CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar8 * 4) = uVar12;
              }
              else {
                this_00 = DefaultLogger::get();
                Logger::warn(this_00,"Encountered double entry in bone weights");
              }
            }
            uVar8 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20 >> 6];
            if ((uVar8 & uVar16) == 0) {
              uVar11 = uVar8 | uVar16;
              if (this->mThreshold <= local_9c) {
                uVar11 = uVar8 & local_60;
              }
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] = uVar11;
            }
          }
          uVar18 = uVar18 + 1;
          ppaVar9 = pMesh->mBones;
          paVar14 = ppaVar9[uVar20];
        } while (uVar18 < paVar14->mNumWeights);
        uVar7 = pMesh->mNumBones;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar7);
  }
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b8,(ulong)pMesh->mNumFaces,(value_type_conflict2 *)&local_98,
             (allocator_type *)&local_e8);
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,(ulong)pMesh->mNumBones,(value_type_conflict2 *)&local_e8,
             (allocator_type *)&local_c8);
  if (pMesh->mNumFaces != 0) {
    uVar20 = 0;
    iVar13 = 0;
    do {
      paVar17 = pMesh->mFaces;
      uVar7 = *(uint *)(CONCAT71(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                       (ulong)*paVar17[uVar20].mIndices * 4);
      uVar10 = paVar17[uVar20].mNumIndices;
      uVar19 = 1;
      if (1 < uVar10) {
        uVar16 = 1;
        do {
          uVar10 = *(uint *)(CONCAT71(local_78.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      local_78.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                            (ulong)paVar17[uVar20].mIndices[uVar16] * 4);
          if (uVar7 == uVar10) {
            uVar19 = uVar19 + 1;
          }
          else {
            uVar15 = pMesh->mNumBones;
            if (uVar7 < uVar15) {
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] |
                   1L << ((byte)uVar7 & 0x3f);
              uVar15 = pMesh->mNumBones;
            }
            if (uVar10 < uVar15) {
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] |
                   1L << ((byte)uVar10 & 0x3f);
            }
          }
          uVar16 = uVar16 + 1;
          paVar17 = pMesh->mFaces;
          uVar10 = paVar17[uVar20].mNumIndices;
        } while (uVar16 < uVar10);
      }
      if ((uVar7 < pMesh->mNumBones) && (uVar19 == uVar10)) {
        *(uint *)(CONCAT44(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar20 * 4) = uVar7;
        piVar1 = (int *)(CONCAT44(local_98.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_98.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) + (ulong)uVar7 * 4
                        );
        *piVar1 = *piVar1 + 1;
      }
      else {
        iVar13 = iVar13 + 1;
      }
      uVar20 = uVar20 + 1;
      uVar16 = (ulong)pMesh->mNumFaces;
    } while (uVar20 < uVar16);
    if (pMesh->mNumFaces == 0) {
      if (iVar13 == 0) goto LAB_0036a57c;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    }
    else {
      uVar20 = 0;
      do {
        uVar7 = *(uint *)(CONCAT44(local_b8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_b8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar20 * 4);
        uVar18 = (ulong)uVar7;
        if ((uVar7 < pMesh->mNumBones) &&
           ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] >> (uVar18 & 0x3f) & 1) != 0)) {
          iVar3 = *(int *)(CONCAT44(local_98.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_98.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar18 * 4);
          if (iVar3 == 0) {
            __assert_fail("facesPerBone[faceBones[i]]>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/DeboneProcess.cpp"
                          ,0x149,
                          "void Assimp::DeboneProcess::SplitMesh(const aiMesh *, std::vector<std::pair<aiMesh *, const aiBone *>> &) const"
                         );
          }
          *(int *)(CONCAT44(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar18 * 4) =
               iVar3 + -1;
          iVar13 = iVar13 + 1;
          *(undefined4 *)
           (CONCAT44(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar20 * 4) = 0xffffffff;
          uVar16 = (ulong)pMesh->mNumFaces;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar16);
      if (iVar13 == 0) goto LAB_0036a57c;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_c8.first = (aiMesh *)((ulong)local_c8.first & 0xffffffff00000000);
      if ((int)uVar16 != 0) {
        uVar7 = 0;
        do {
          if (*(int *)(CONCAT44(local_b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_) + (ulong)uVar7 * 4)
              == -1) {
            if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_e8,
                         (iterator)
                         local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_c8);
            }
            else {
              *local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar7;
              local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar7 = (int)local_c8.first + 1;
          local_c8.first = (aiMesh *)CONCAT44(local_c8.first._4_4_,uVar7);
        } while (uVar7 < pMesh->mNumFaces);
      }
    }
    local_c8.first = MakeSubmesh(pMesh,&local_e8,0);
    local_c8.second = (aiBone *)0x0;
    iVar4._M_current = *(pair<aiMesh_*,_const_aiBone_*> **)(local_80 + 8);
    if (iVar4._M_current == *(pair<aiMesh_*,_const_aiBone_*> **)(local_80 + 0x10)) {
      std::vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
      ::_M_realloc_insert<std::pair<aiMesh*,aiBone_const*>const&>(local_80,iVar4,&local_c8);
    }
    else {
      local_c8.first._4_4_ = (undefined4)((ulong)local_c8.first >> 0x20);
      *(int *)&(iVar4._M_current)->first = (int)local_c8.first;
      *(undefined4 *)((long)&(iVar4._M_current)->first + 4) = local_c8.first._4_4_;
      *(undefined4 *)&(iVar4._M_current)->second = 0;
      *(undefined4 *)((long)&(iVar4._M_current)->second + 4) = 0;
      *(long *)(local_80 + 8) = *(long *)(local_80 + 8) + 0x10;
    }
    if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
LAB_0036a57c:
  uVar7 = pMesh->mNumBones;
  if (uVar7 != 0) {
    uVar20 = 0;
    do {
      if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0) &&
         (*(int *)(CONCAT44(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar20 * 4) != 0)) {
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        local_c8.first = (aiMesh *)((ulong)local_c8.first & 0xffffffff00000000);
        if (pMesh->mNumFaces != 0) {
          uVar7 = 0;
          do {
            if (uVar20 == *(uint *)(CONCAT44(local_b8.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_b8.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (ulong)uVar7 * 4)) {
              if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_e8,
                           (iterator)
                           local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_c8);
              }
              else {
                *local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = uVar7;
                local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar7 = (int)local_c8.first + 1;
            local_c8.first = (aiMesh *)CONCAT44(local_c8.first._4_4_,uVar7);
          } while (uVar7 < pMesh->mNumFaces);
        }
        this_01 = pMesh;
        mesh = MakeSubmesh(pMesh,&local_e8,1);
        ApplyTransform((DeboneProcess *)this_01,mesh,&pMesh->mBones[uVar20]->mOffsetMatrix);
        local_c8.second = pMesh->mBones[uVar20];
        iVar4._M_current = *(pair<aiMesh_*,_const_aiBone_*> **)(local_80 + 8);
        local_c8.first = mesh;
        if (iVar4._M_current == *(pair<aiMesh_*,_const_aiBone_*> **)(local_80 + 0x10)) {
          std::
          vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
          ::_M_realloc_insert<std::pair<aiMesh*,aiBone_const*>const&>(local_80,iVar4,&local_c8);
        }
        else {
          local_c8.first._0_4_ = (int)mesh;
          local_c8.first._4_4_ = (undefined4)((ulong)mesh >> 0x20);
          local_c8.second._4_4_ = (undefined4)((ulong)local_c8.second >> 0x20);
          *(int *)&(iVar4._M_current)->first = (int)local_c8.first;
          *(undefined4 *)((long)&(iVar4._M_current)->first + 4) = local_c8.first._4_4_;
          *(undefined4 *)&(iVar4._M_current)->second = local_c8.second._0_4_;
          *(undefined4 *)((long)&(iVar4._M_current)->second + 4) = local_c8.second._4_4_;
          *(long *)(local_80 + 8) = *(long *)(local_80 + 8) + 0x10;
        }
        if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar7 = pMesh->mNumBones;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar7);
  }
  pvVar6 = (void *)CONCAT44(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_98.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  pvVar6 = (void *)CONCAT44(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_b8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  pvVar6 = (void *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void DeboneProcess::SplitMesh( const aiMesh* pMesh, std::vector< std::pair< aiMesh*,const aiBone* > >& poNewMeshes) const
{
    // same deal here as ConsiderMesh basically

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;

            if(w>=mThreshold) {
                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }
    }

    unsigned int nFacesUnowned = 0;

    std::vector<unsigned int> faceBones(pMesh->mNumFaces,UINT_MAX);
    std::vector<unsigned int> facesPerBone(pMesh->mNumBones,0);

    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        unsigned int nInterstitial = 1;

        unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

        for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
            unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

            if(v!=w)    {
                if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
            }
            else nInterstitial++;
        }

        if(v<pMesh->mNumBones &&nInterstitial==pMesh->mFaces[i].mNumIndices)    {
            faceBones[i] = v; //primitive belongs to bone #v
            facesPerBone[v]++;
        }
        else nFacesUnowned++;
    }

    // invalidate any "cojoined" faces
    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        if(faceBones[i]<pMesh->mNumBones&&isBoneNecessary[faceBones[i]])
        {
            ai_assert(facesPerBone[faceBones[i]]>0);
            facesPerBone[faceBones[i]]--;

            nFacesUnowned++;
            faceBones[i] = cUnowned;
        }
    }

    if(nFacesUnowned) {
        std::vector<unsigned int> subFaces;

        for(unsigned int i=0;i<pMesh->mNumFaces;i++)    {
            if(faceBones[i]==cUnowned) {
                subFaces.push_back(i);
            }
        }

        aiMesh *baseMesh = MakeSubmesh(pMesh,subFaces,0);
        std::pair<aiMesh*,const aiBone*> push_pair(baseMesh,(const aiBone*)0);

        poNewMeshes.push_back(push_pair);
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++) {

        if(!isBoneNecessary[i]&&facesPerBone[i]>0)  {
            std::vector<unsigned int> subFaces;

            for(unsigned int j=0;j<pMesh->mNumFaces;j++)    {
                if(faceBones[j]==i) {
                    subFaces.push_back(j);
                }
            }

            unsigned int f = AI_SUBMESH_FLAGS_SANS_BONES;
            aiMesh *subMesh =MakeSubmesh(pMesh,subFaces,f);

            //Lifted from PretransformVertices.cpp
            ApplyTransform(subMesh,pMesh->mBones[i]->mOffsetMatrix);
            std::pair<aiMesh*,const aiBone*> push_pair(subMesh,pMesh->mBones[i]);

            poNewMeshes.push_back(push_pair);
        }
    }
}